

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeHangLimitCheck(TranslateToFuzzReader *this)

{
  Name name;
  Name name_00;
  Name name_01;
  Name name_02;
  GlobalGet *pGVar1;
  Unary *condition;
  Const *pCVar2;
  GlobalSet *pGVar3;
  Expression *right;
  Block *pBVar4;
  If *left;
  Binary *value;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  optional<wasm::Type> local_a0;
  Type local_90;
  size_t local_88;
  char *local_80;
  size_t local_78;
  char *local_70;
  optional<wasm::Type> local_60;
  optional<wasm::Type> local_48;
  size_t local_38;
  char *local_30;
  Type local_28;
  size_t local_20;
  char *local_18;
  TranslateToFuzzReader *local_10;
  TranslateToFuzzReader *this_local;
  
  local_20 = (this->HANG_LIMIT_GLOBAL).super_IString.str._M_len;
  local_18 = (this->HANG_LIMIT_GLOBAL).super_IString.str._M_str;
  local_10 = this;
  Type::Type(&local_28,i32);
  name_02.super_IString.str._M_str = local_18;
  name_02.super_IString.str._M_len = local_20;
  pGVar1 = Builder::makeGlobalGet(&this->builder,name_02,local_28);
  condition = Builder::makeUnary(&this->builder,EqZInt32,(Expression *)pGVar1);
  local_38 = (this->HANG_LIMIT_GLOBAL).super_IString.str._M_len;
  local_30 = (this->HANG_LIMIT_GLOBAL).super_IString.str._M_str;
  pCVar2 = Builder::makeConst<int>(&this->builder,(this->fuzzParams->super_FuzzParams).HANG_LIMIT);
  name_01.super_IString.str._M_str = local_30;
  name_01.super_IString.str._M_len = local_38;
  pGVar3 = Builder::makeGlobalSet(&this->builder,name_01,(Expression *)pCVar2);
  right = (Expression *)Builder::makeUnreachable(&this->builder);
  std::optional<wasm::Type>::optional(&local_48);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_7_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       local_48.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_payload;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged =
       local_48.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  pBVar4 = Builder::makeSequence(&this->builder,(Expression *)pGVar3,right,type);
  std::optional<wasm::Type>::optional(&local_60);
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_7_ = 0;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       local_60.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_payload;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged =
       local_60.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  left = Builder::makeIf(&this->builder,(Expression *)condition,(Expression *)pBVar4,
                         (Expression *)0x0,type_01);
  local_78 = (this->HANG_LIMIT_GLOBAL).super_IString.str._M_len;
  local_70 = (this->HANG_LIMIT_GLOBAL).super_IString.str._M_str;
  local_88 = (this->HANG_LIMIT_GLOBAL).super_IString.str._M_len;
  local_80 = (this->HANG_LIMIT_GLOBAL).super_IString.str._M_str;
  Type::Type(&local_90,i32);
  name.super_IString.str._M_str = local_80;
  name.super_IString.str._M_len = local_88;
  pGVar1 = Builder::makeGlobalGet(&this->builder,name,local_90);
  pCVar2 = Builder::makeConst<int>(&this->builder,1);
  value = Builder::makeBinary(&this->builder,SubInt32,(Expression *)pGVar1,(Expression *)pCVar2);
  name_00.super_IString.str._M_str = local_70;
  name_00.super_IString.str._M_len = local_78;
  pGVar3 = Builder::makeGlobalSet(&this->builder,name_00,(Expression *)value);
  std::optional<wasm::Type>::optional(&local_a0);
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_7_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       local_a0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_payload;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged =
       local_a0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  pBVar4 = Builder::makeSequence(&this->builder,(Expression *)left,(Expression *)pGVar3,type_00);
  return (Expression *)pBVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeHangLimitCheck() {
  // If the hang limit global reaches 0 then we trap and reset it. That allows
  // calls to other exports to proceed, with hang checking, after the trap halts
  // the currently called export.
  return builder.makeSequence(
    builder.makeIf(
      builder.makeUnary(UnaryOp::EqZInt32,
                        builder.makeGlobalGet(HANG_LIMIT_GLOBAL, Type::i32)),
      builder.makeSequence(builder.makeGlobalSet(HANG_LIMIT_GLOBAL,
                                                 builder.makeConst(int32_t(
                                                   fuzzParams->HANG_LIMIT))),
                           builder.makeUnreachable())),
    builder.makeGlobalSet(
      HANG_LIMIT_GLOBAL,
      builder.makeBinary(BinaryOp::SubInt32,
                         builder.makeGlobalGet(HANG_LIMIT_GLOBAL, Type::i32),
                         builder.makeConst(int32_t(1)))));
}